

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clMemFreeINTEL(cl_context context,void *ptr)

{
  bool bVar1;
  CLIntercept *this;
  CLdispatchX *pCVar2;
  time_point start;
  SConfig *pSVar3;
  CObjectTracker *this_00;
  void *in_RSI;
  cl_context in_RDI;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  cl_int in_stack_00000114;
  char *in_stack_00000118;
  CLIntercept *in_stack_00000120;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff00;
  CLIntercept *in_stack_ffffffffffffff08;
  allocator *paVar4;
  CLIntercept *in_stack_ffffffffffffff10;
  allocator *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  allocator local_c1;
  string local_c0 [32];
  CLIntercept *local_a0;
  duration local_98;
  cl_sync_point_khr *in_stack_ffffffffffffff70;
  cl_event *in_stack_ffffffffffffff78;
  cl_int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  CLIntercept *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa0;
  CLIntercept *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  time_point in_stack_ffffffffffffffb8;
  time_point in_stack_ffffffffffffffc0;
  duration in_stack_ffffffffffffffc8;
  cl_int local_4;
  
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pCVar2 = CLIntercept::dispatchX
                         (in_stack_ffffffffffffff10,(cl_context)in_stack_ffffffffffffff08),
     pCVar2->clMemFreeINTEL == (_func_cl_int_cl_context_void_ptr *)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xffffffffffffff24)
    ;
    local_4 = -0x22;
  }
  else {
    start.__d.__r = (duration)CLIntercept::getEnqueueCounter(in_stack_ffffffffffffff08);
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingEnter
                (this,"clMemFreeINTEL",(uint64_t)start.__d.__r,(cl_kernel)0x0,
                 "context = %p, ptr = %p",in_RDI,in_RSI);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_ffffffffffffff00);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_ffffffffffffff00);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffb8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc8.__r = (rep)in_stack_ffffffffffffffb8.__d.__r;
    }
    local_4 = (*pCVar2->clMemFreeINTEL)(in_RDI,in_RSI);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffa8 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc0.__d.__r = (duration)(duration)in_stack_ffffffffffffffa8;
      pSVar3 = CLIntercept::config(this);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)start.__d.__r)
         , bVar1)) {
        in_stack_ffffffffffffff18 = (allocator *)&stack0xffffffffffffff87;
        std::allocator<char>::allocator();
        local_a0 = (CLIntercept *)in_stack_ffffffffffffffc0.__d.__r;
        local_98.__r = in_stack_ffffffffffffffc8.__r;
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff88,"",in_stack_ffffffffffffff18);
        in_stack_ffffffffffffffc0.__d.__r = (duration)(duration)local_a0;
        CLIntercept::updateHostTimingStats
                  (local_a0,(char *)in_stack_ffffffffffffffb8.__d.__r,
                   (string *)CONCAT44(local_4,in_stack_ffffffffffffffb0),start,
                   (time_point)local_98.__r);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
      }
    }
    if ((in_RSI != (void *)0x0) &&
       ((((pSVar3 = CLIntercept::config(this), (pSVar3->DumpBuffersBeforeEnqueue & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(this), (pSVar3->DumpBuffersAfterEnqueue & 1U) != 0)) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->InjectBuffers & 1U) != 0)) ||
        ((pSVar3 = CLIntercept::config(this), (pSVar3->InjectImages & 1U) != 0 ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->CaptureReplay & 1U) != 0)))))) {
      CLIntercept::removeUSMAllocation
                ((CLIntercept *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) && (local_4 != 0)) {
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000120,in_stack_00000118,in_stack_00000114);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->NoErrors & 1U) != 0) {
        local_4 = 0;
      }
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->LeakChecking & 1U) != 0) {
      this_00 = CLIntercept::objectTracker(this);
      CObjectTracker::AddPointerFree(this_00,in_RSI);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      paVar4 = &local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"",paVar4);
      CLIntercept::chromeCallLoggingExit
                ((CLIntercept *)CONCAT44(local_4,in_stack_ffffffffffffffb0),
                 (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (bool)in_stack_ffffffffffffff9f,(uint64_t)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clMemFreeINTEL(
    cl_context context,
    void* ptr)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clMemFreeINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER( "context = %p, ptr = %p",
                context,
                ptr );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clMemFreeINTEL(
                context,
                ptr );

            HOST_PERFORMANCE_TIMING_END();
            REMOVE_USM_ALLOCATION( ptr );
            CHECK_ERROR( retVal );
            ADD_POINTER_FREE( ptr );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_CONTEXT);
}